

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.h
# Opt level: O3

char16 __thiscall
UnifiedRegex::CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::ToCanonical
          (CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_> *this,char16 c)

{
  CaseMapper<UnifiedRegex::TrivialCaseMapper> *pCVar1;
  bool bVar2;
  BOOL BVar3;
  unsigned_long uVar4;
  Type TVar5;
  Type *pTVar6;
  uint k;
  undefined6 in_register_00000032;
  Type local_28;
  unsigned_long lastOcc;
  
  k = (uint)CONCAT62(in_register_00000032,c);
  if (k < 0x100) {
    BVar3 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                      (&this->toEquivs,k);
    if (BVar3 == 0) {
      uVar4 = (this->toEquivs).defv;
    }
    else {
      uVar4 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                        (&this->toEquivs,k);
    }
    if (uVar4 != 0xffffffffffffffff) goto LAB_00ea26e0;
    pCVar1 = this->fallbackMapper;
    BVar3 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                      (&pCVar1->toEquivs,k);
    if (BVar3 == 0) {
      TVar5 = (pCVar1->toEquivs).defv;
    }
    else {
      TVar5 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                        (&pCVar1->toEquivs,k);
    }
  }
  else {
    bVar2 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                      (&this->toEquivs,k,&local_28);
    pTVar6 = &(this->toEquivs).defv;
    if (bVar2) {
      pTVar6 = &local_28;
    }
    uVar4 = *pTVar6;
    if (uVar4 != 0xffffffffffffffff) goto LAB_00ea26e0;
    pCVar1 = this->fallbackMapper;
    bVar2 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                      (&pCVar1->toEquivs,k,&local_28);
    pTVar6 = &(pCVar1->toEquivs).defv;
    if (bVar2) {
      pTVar6 = &local_28;
    }
    TVar5 = *pTVar6;
  }
  uVar4 = TVar5 & 0xffffffff;
  if (TVar5 == 0xffffffffffffffff) {
    uVar4 = CONCAT62(in_register_00000032,c) & 0xffffffff;
  }
LAB_00ea26e0:
  return (char16)uVar4;
}

Assistant:

inline char16 ToCanonical(char16 c) const
        {
            uint64 r = toEquivs.Get(c);
            return r == EQUIV_MISSING ? fallbackMapper->ToCanonical(c) : Chars<char16>::UTC(r & 0xffff);
        }